

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Cast * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::doCast<wasm::BrOn>
          (Cast *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,BrOn *curr)

{
  char cVar1;
  Literal *pLVar2;
  Literal *this_00;
  Flow local_170;
  Flow local_128;
  undefined1 local_e0 [8];
  Flow ref;
  Literal local_80;
  Literal local_68;
  Literal local_50;
  undefined1 local_38 [8];
  Literal val;
  
  visit((Flow *)local_e0,this,*(Expression **)(curr + 0x28));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    pLVar2 = Flow::getSingleValue((Flow *)local_e0);
    wasm::Literal::Literal((Literal *)local_38,pLVar2);
    cVar1 = wasm::Type::isSubType
                      ((Type)val.field_0.gcData.
                             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,(Type)*(uintptr_t *)(curr + 0x30));
    if (cVar1 == '\0') {
      wasm::Literal::Literal(&local_50,(Literal *)local_38);
      this_00 = &local_80;
      pLVar2 = &local_50;
      wasm::Literal::Literal(this_00,pLVar2);
      std::__detail::__variant::
      _Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
      ::_Variant_storage<2ul,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure&>
                ((_Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                  *)__return_storage_ptr__,this_00);
    }
    else {
      wasm::Literal::Literal(&local_68,(Literal *)local_38);
      this_00 = (Literal *)&ref.breakTo.super_IString.str._M_str;
      pLVar2 = &local_68;
      wasm::Literal::Literal(this_00,pLVar2);
      std::__detail::__variant::
      _Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
      ::_Variant_storage<1ul,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success&>
                ((_Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                  *)__return_storage_ptr__,this_00);
    }
    wasm::Literal::~Literal(this_00);
    wasm::Literal::~Literal(pLVar2);
    wasm::Literal::~Literal((Literal *)local_38);
  }
  else {
    Flow::Flow(&local_128,(Flow *)local_e0);
    Flow::Flow(&local_170,&local_128);
    std::__detail::__variant::
    _Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
    ::_Variant_storage<0ul,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking&>
              ((_Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                *)__return_storage_ptr__,&local_170);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&local_170);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&local_128);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

Cast doCast(T* curr) {
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return typename Cast::Breaking{ref};
    }
    Literal val = ref.getSingleValue();
    Type castType = curr->getCastType();
    if (Type::isSubType(val.type, castType)) {
      return typename Cast::Success{val};
    } else {
      return typename Cast::Failure{val};
    }
  }